

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O0

void d68000_bra_16(m68k_info *info)

{
  uint value;
  m68k_info *in_RDI;
  m68k_info *unaff_retaddr;
  int displacement;
  m68k_info *pmVar1;
  
  pmVar1 = in_RDI;
  value = read_imm_16(in_RDI);
  displacement = (int)((ulong)in_RDI >> 0x20);
  make_int_16(value);
  build_relative_branch(unaff_retaddr,(int)((ulong)pmVar1 >> 0x20),(int)pmVar1,displacement);
  return;
}

Assistant:

static void d68000_bra_16(m68k_info *info)
{
	build_relative_branch(info, M68K_INS_BRA, 2, make_int_16(read_imm_16(info)));
}